

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O2

void __thiscall
enact::ReferenceTypename::ReferenceTypename
          (ReferenceTypename *this,optional<enact::Token> *permission,optional<enact::Token> *region
          ,unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
           *referringTypename)

{
  allocator<char> local_b2;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__ReferenceTypename_001249d0;
  std::_Optional_base<enact::Token,_false,_false>::_Optional_base
            (&(this->m_permission).super__Optional_base<enact::Token,_false,_false>,
             &permission->super__Optional_base<enact::Token,_false,_false>);
  std::_Optional_base<enact::Token,_false,_false>::_Optional_base
            (&(this->m_region).super__Optional_base<enact::Token,_false,_false>,
             &region->super__Optional_base<enact::Token,_false,_false>);
  (this->m_referringTypename)._M_t.
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
       (referringTypename->_M_t).
       super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
       super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl;
  (referringTypename->_M_t).
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl = (Typename *)0x0;
  if ((this->m_permission).super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_engaged == true) {
    std::__cxx11::string::string
              ((string *)&local_90,
               (string *)
               &(this->m_permission).super__Optional_base<enact::Token,_false,_false>._M_payload.
                super__Optional_payload<enact::Token,_true,_false,_false>.
                super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_b1);
  }
  std::operator+(&local_70,"&",&local_90);
  std::operator+(&local_50,&local_70," ");
  if ((this->m_region).super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_engaged == true) {
    std::__cxx11::string::string
              ((string *)&local_b0,
               (string *)
               &(this->m_region).super__Optional_base<enact::Token,_false,_false>._M_payload.
                super__Optional_payload<enact::Token,_true,_false,_false>.
                super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b2);
  }
  std::operator+(&this->m_name,&local_50,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

ReferenceTypename::ReferenceTypename(
            std::optional<Token> permission,
            std::optional<Token> region,
            std::unique_ptr<const Typename> referringTypename) :
            m_permission{std::move(permission)},
            m_region{std::move(region)},
            m_referringTypename{std::move(referringTypename)},
            m_name{
                    "&" +
                    (m_permission ? m_permission->lexeme : "") + " " +
                    (m_region ? m_region->lexeme : "")} {
    }